

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

IRIns * lj_snap_regspmap(jit_State *J,GCtrace *T,SnapNo snapno,IRIns *ir)

{
  uint uVar1;
  SnapEntry *pSVar2;
  RegSP RVar3;
  BloomFilter BVar4;
  IRIns *in_RCX;
  uint in_EDX;
  GCtrace *in_RSI;
  uint32_t rs;
  IRRef ref;
  MSize n;
  BloomFilter rfilt;
  SnapEntry *map;
  SnapShot *snap;
  ushort local_44;
  uint local_40;
  uint local_3c;
  IRIns *local_20;
  
  pSVar2 = in_RSI->snapmap;
  uVar1 = in_RSI->snap[in_EDX].mapofs;
  BVar4 = snap_renamefilter(in_RSI,in_EDX);
  local_3c = 0;
  local_20 = in_RCX;
  do {
    if ((local_20->field_1).o == 'F') {
      if (((local_20->field_0).op2 & 1) == 0) {
        return local_20;
      }
      while (pSVar2[(ulong)uVar1 + (ulong)local_3c] >> 0x18 != (uint)(local_20->field_0).op1) {
        local_3c = local_3c + 1;
      }
      local_40 = pSVar2[(ulong)uVar1 + (ulong)local_3c] & 0xffff;
      local_3c = local_3c + 1;
    }
    else {
      if ((local_20->field_1).o != '\x0e') {
        return local_20;
      }
      local_40 = (local_20->field_0).op1 + 0x8000;
    }
    local_44 = *(ushort *)((long)in_RSI->ir + (ulong)local_40 * 8 + 6);
    if ((BVar4 & 1L << ((byte)local_40 & 0x3f)) != 0) {
      RVar3 = snap_renameref(in_RSI,in_EDX,local_40,(uint)local_44);
      local_44 = (ushort)RVar3;
    }
    (local_20->field_0).prev = local_44;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

IRIns *lj_snap_regspmap(jit_State *J, GCtrace *T, SnapNo snapno, IRIns *ir)
{
  SnapShot *snap = &T->snap[snapno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  MSize n = 0;
  IRRef ref = 0;
  UNUSED(J);
  for ( ; ; ir++) {
    uint32_t rs;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & IRSLOAD_PARENT)) break;
      for ( ; ; n++) {
	lj_assertJ(n < snap->nent, "slot %d not found in snapshot", ir->op1);
	if (snap_slot(map[n]) == ir->op1) {
	  ref = snap_ref(map[n++]);
	  break;
	}
      }
    } else if (LJ_SOFTFP32 && ir->o == IR_HIOP) {
      ref++;
    } else if (ir->o == IR_PVAL) {
      ref = ir->op1 + REF_BIAS;
    } else {
      break;
    }
    rs = T->ir[ref].prev;
    if (bloomtest(rfilt, ref))
      rs = snap_renameref(T, snapno, ref, rs);
    ir->prev = (uint16_t)rs;
    lj_assertJ(regsp_used(rs), "unused IR %04d in snapshot", ref - REF_BIAS);
  }
  return ir;
}